

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::anon_unknown_7::LineBufferTask::LineBufferTask
          (LineBufferTask *this,TaskGroup *group,Data *ofd,int number,int scanLineMin,
          int scanLineMax)

{
  int iVar1;
  pointer ppLVar2;
  LineBuffer *pLVar3;
  Data *pDVar4;
  int iVar5;
  
  IlmThread_3_4::Task::Task(&this->super_Task,group);
  *(undefined ***)this = &PTR__LineBufferTask_001e5dd0;
  this->_ofd = (Data *)ofd;
  ppLVar2 = (ofd->lineBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->_lineBuffer =
       ppLVar2[(ulong)(long)number %
               (ulong)((long)(ofd->lineBuffers).
                             super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3)];
  IlmThread_3_4::Semaphore::wait();
  pLVar3 = this->_lineBuffer;
  if (*(char *)&(pLVar3->sampleCountTableBuffer)._data == '\0') {
    pLVar3->dataPtr = (char *)(pLVar3->buffer)._data;
    pDVar4 = this->_ofd;
    iVar1 = (int)pDVar4->lineOffsetsPosition;
    iVar5 = number * iVar1 + *(int *)((long)&(pDVar4->frameBuffer)._sampleCounts.xStride + 4);
    *(int *)&pLVar3->uncompressedDataSize = iVar5;
    iVar5 = iVar1 + iVar5 + -1;
    iVar1 = (int)(pDVar4->frameBuffer)._sampleCounts.yStride;
    if (iVar1 < iVar5) {
      iVar5 = iVar1;
    }
    *(int *)((long)&pLVar3->uncompressedDataSize + 4) = iVar5;
    *(undefined1 *)&(pLVar3->sampleCountTableBuffer)._data = 1;
  }
  iVar1 = (int)pLVar3->uncompressedDataSize;
  iVar5 = *(int *)((long)&pLVar3->uncompressedDataSize + 4);
  if (scanLineMin < iVar1) {
    scanLineMin = iVar1;
  }
  *(int *)&pLVar3->dataSize = scanLineMin;
  if (iVar5 < scanLineMax) {
    scanLineMax = iVar5;
  }
  *(int *)((long)&pLVar3->dataSize + 4) = scanLineMax;
  return;
}

Assistant:

LineBufferTask::LineBufferTask (
    TaskGroup*        group,
    OutputFile::Data* ofd,
    int               number,
    int               scanLineMin,
    int               scanLineMax)
    : Task (group), _ofd (ofd), _lineBuffer (_ofd->getLineBuffer (number))
{
    //
    // Wait for the lineBuffer to become available
    //

    _lineBuffer->wait ();

    //
    // Initialize the lineBuffer data if necessary
    //

    if (!_lineBuffer->partiallyFull)
    {
        _lineBuffer->endOfLineBufferData = _lineBuffer->buffer;

        _lineBuffer->minY = _ofd->minY + number * _ofd->linesInBuffer;

        _lineBuffer->maxY =
            min (_lineBuffer->minY + _ofd->linesInBuffer - 1, _ofd->maxY);

        _lineBuffer->partiallyFull = true;
    }

    _lineBuffer->scanLineMin = max (_lineBuffer->minY, scanLineMin);
    _lineBuffer->scanLineMax = min (_lineBuffer->maxY, scanLineMax);
}